

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

SyHashEntry_Pr * HashGetEntry(SyHash *pHash,void *pKey,sxu32 nKeyLen)

{
  SyHashEntry_Pr *pSVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  SyHashEntry_Pr **ppSVar4;
  
  sVar2 = (*pHash->xHash)(pKey,nKeyLen);
  ppSVar4 = pHash->apBucket + (pHash->nBucketSize - 1 & sVar2);
  while( true ) {
    pSVar1 = *ppSVar4;
    if (pSVar1 == (SyHashEntry_Pr *)0x0) {
      return (SyHashEntry_Pr *)0x0;
    }
    if (((pSVar1->nHash == sVar2) && (pSVar1->nKeyLen == nKeyLen)) &&
       (sVar3 = (*pHash->xCmp)(pSVar1->pKey,pKey,nKeyLen), sVar3 == 0)) break;
    ppSVar4 = &pSVar1->pNextCollide;
  }
  return pSVar1;
}

Assistant:

static SyHashEntry_Pr * HashGetEntry(SyHash *pHash, const void *pKey, sxu32 nKeyLen)
{
	SyHashEntry_Pr *pEntry;
	sxu32 nHash;

	nHash = pHash->xHash(pKey, nKeyLen);
	pEntry = pHash->apBucket[nHash & (pHash->nBucketSize - 1)];
	for(;;){
		if( pEntry == 0 ){
			break;
		}
		if( pEntry->nHash == nHash && pEntry->nKeyLen == nKeyLen && 
			pHash->xCmp(pEntry->pKey, pKey, nKeyLen) == 0 ){
				return pEntry;
		}
		pEntry = pEntry->pNextCollide;
	}
	/* Entry not found */
	return 0;
}